

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ExpressionOrDistSyntax::setChild
          (ExpressionOrDistSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  
  pSVar1 = TokenOrSyntax::node(&child);
  if (pSVar1 == (SyntaxNode *)0x0) {
    pSVar1 = (SyntaxNode *)0x0;
  }
  else {
    pSVar1 = TokenOrSyntax::node(&child);
  }
  (&this->expr)[index != 0].ptr = (ExpressionSyntax *)pSVar1;
  return;
}

Assistant:

void ExpressionOrDistSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 1: distribution = child.node() ? &child.node()->as<DistConstraintListSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}